

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<signed_char,_int,_duckdb::ParquetCastOperator>::
WriteVectorInternal<true>
          (StandardColumnWriter<signed_char,_int,_duckdb::ParquetCastOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  Vector *col;
  unsigned_long *puVar1;
  int iVar2;
  idx_t i;
  Allocator *pAVar3;
  long lVar4;
  idx_t iVar5;
  idx_t iVar6;
  primitive_dictionary_entry_t *ppVar7;
  InternalException *this_00;
  NumericStatisticsState<signed_char,_int,_duckdb::BaseParquetOperator> *numeric_stats;
  WriteStream *ser;
  idx_t r;
  ValidityMask *mask;
  VectorType *value;
  int target_value;
  string local_58;
  StandardColumnWriter<signed_char,_int,_duckdb::ParquetCastOperator> *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_38 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_01cd5703_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Unknown encoding","");
    InternalException::InternalException(this_00,&local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  col = (Vector *)input_column->data;
  mask = &input_column->validity;
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
      TemplatedWritePlain<signed_char,int,duckdb::ParquetCastOperator,true>
                (col,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<signed_char,int,duckdb::ParquetCastOperator,false>
              (col,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_01cd5703_caseD_1;
  case 5:
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar5 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar6 = iVar5, (puVar1[iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          iVar2 = (int)(char)(&col->vector_type)[iVar6];
          if (iVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar2;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar2) {
            *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar2;
          }
          local_58._M_dataplus._M_p = (pointer)(long)iVar2;
          DbpEncoder::BeginWriteInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)&local_58);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar6 + 1;
          goto LAB_01cd5a20;
        }
        iVar5 = iVar5 + 1;
      } while (chunk_end != iVar5);
    }
    else {
LAB_01cd5a20:
      if (chunk_start < chunk_end) {
        do {
          iVar2 = (int)(char)(&col->vector_type)[chunk_start];
          if (iVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar2;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar2) {
            *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar2;
          }
          local_58._M_dataplus._M_p = (pointer)(long)iVar2;
          DbpEncoder::WriteValueInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)&local_58);
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar5 = chunk_start;
      do {
        iVar6 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar6 = iVar5, (puVar1[iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0)) {
          iVar2 = (int)(char)(&col->vector_type)[iVar6];
          local_58._M_dataplus._M_p._0_4_ = iVar2;
          if (iVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar2;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar2) {
            *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar2;
          }
          pAVar3 = BufferAllocator::Get
                             (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<int>
                    ((DlbaEncoder *)(page_state_p + 0x909),pAVar3,temp_writer,(int *)&local_58);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar6 + 1;
          goto LAB_01cd591d;
        }
        iVar5 = iVar5 + 1;
      } while (chunk_end != iVar5);
    }
    else {
LAB_01cd591d:
      if (chunk_start < chunk_end) {
        do {
          iVar2 = (int)(char)(&col->vector_type)[chunk_start];
          local_58._M_dataplus._M_p._0_4_ = iVar2;
          if (iVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar2;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar2) {
            *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar2;
          }
          DlbaEncoder::WriteValue<int>
                    ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(int *)&local_58);
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar5 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = chunk_start;
      do {
        iVar5 = chunk_start;
        if ((puVar1 == (unsigned_long *)0x0) ||
           (iVar5 = iVar6, (puVar1[iVar6 >> 6] >> (iVar6 & 0x3f) & 1) != 0)) {
          local_58._M_dataplus._M_p._0_1_ =
               *(undefined1 *)((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4);
          (**temp_writer->_vptr_WriteStream)(temp_writer,&local_58,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_01cd59a0;
        }
        iVar6 = iVar6 + 1;
      } while (chunk_end != iVar6);
    }
    else {
LAB_01cd59a0:
      lVar4 = chunk_end - iVar5;
      if (iVar5 <= chunk_end && lVar4 != 0) {
        value = &col->vector_type + iVar5;
        do {
          ppVar7 = PrimitiveDictionary<signed_char,_int,_duckdb::ParquetCastOperator>::Lookup
                             ((PrimitiveDictionary<signed_char,_int,_duckdb::ParquetCastOperator> *)
                              page_state_p[0x121b]._vptr_ColumnWriterPageState,(char *)value);
          local_58._M_dataplus._M_p._0_4_ = ppVar7->index;
          RleBpEncoder::WriteValue
                    ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)&local_58);
          value = value + 1;
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar3 = BufferAllocator::Get
                         (((local_38->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar3);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        iVar2 = (int)(char)(&col->vector_type)[chunk_start];
        local_58._M_dataplus._M_p._0_4_ = iVar2;
        if (iVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
          *(int *)&stats[1]._vptr_ColumnWriterStatistics = iVar2;
        }
        if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < iVar2) {
          *(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = iVar2;
        }
        lVar4 = 0;
        do {
          *(undefined1 *)
           ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
           (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar4 +
                 (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
               *(undefined1 *)((long)&local_58._M_dataplus._M_p + lVar4);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        page_state_p[0x1217]._vptr_ColumnWriterPageState =
             (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}